

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_tests.cpp
# Opt level: O0

void __thiscall pool_tests::basic_allocating::test_method(basic_allocating *this)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  long in_FS_OFFSET;
  PoolResource<8UL,_8UL> *in_stack_ffffffffffffee58;
  lazy_ostream *in_stack_ffffffffffffee60;
  PoolResource<8UL,_8UL> *in_stack_ffffffffffffee68;
  undefined7 in_stack_ffffffffffffee70;
  undefined1 in_stack_ffffffffffffee77;
  size_t in_stack_ffffffffffffee78;
  const_string *in_stack_ffffffffffffee80;
  PoolResource<8UL,_8UL> *in_stack_ffffffffffffee88;
  size_t line_num;
  undefined7 in_stack_ffffffffffffee90;
  undefined1 in_stack_ffffffffffffee97;
  lazy_ostream *in_stack_ffffffffffffee98;
  PoolResource<8UL,_8UL> *in_stack_ffffffffffffeea8;
  PoolResource<8UL,_8UL> *resource_00;
  undefined7 in_stack_ffffffffffffeef0;
  undefined1 in_stack_ffffffffffffeef7;
  void *p;
  basic_allocating *this_local;
  const_string local_eb0 [2];
  lazy_ostream local_e90 [2];
  const_string *local_e70;
  assertion_result local_e48 [2];
  const_string local_e10 [2];
  lazy_ostream local_df0 [3];
  undefined4 local_db4;
  assertion_result local_d98 [2];
  const_string local_d60 [2];
  lazy_ostream local_d40 [2];
  size_t local_d20;
  assertion_result local_cf8 [2];
  const_string local_cc0 [2];
  lazy_ostream local_ca0 [3];
  undefined4 local_c64;
  assertion_result local_c48 [2];
  const_string local_c10 [2];
  lazy_ostream local_bf0 [2];
  size_t local_bd0;
  assertion_result local_ba8 [2];
  const_string local_b70 [2];
  lazy_ostream local_b50 [3];
  undefined4 local_b14;
  assertion_result local_af8 [2];
  const_string local_ac0 [2];
  lazy_ostream local_aa0 [2];
  size_t local_a80;
  assertion_result local_a58 [2];
  const_string local_a20 [2];
  lazy_ostream local_a00 [3];
  undefined4 local_9c4;
  assertion_result local_9a8 [2];
  const_string local_970 [2];
  lazy_ostream local_950 [2];
  size_t local_930;
  assertion_result local_908 [2];
  const_string local_8d0 [2];
  lazy_ostream local_8b0 [3];
  undefined4 local_874;
  assertion_result local_858 [2];
  const_string local_820 [2];
  lazy_ostream local_800 [2];
  size_t local_7e0;
  assertion_result local_7b8 [2];
  const_string local_780 [2];
  lazy_ostream local_760 [3];
  undefined4 local_724;
  assertion_result local_708 [2];
  const_string local_6d0 [2];
  lazy_ostream local_6b0 [4];
  assertion_result local_670 [2];
  const_string local_638 [2];
  lazy_ostream local_618 [2];
  size_t local_5f8;
  assertion_result local_5d0 [2];
  const_string local_598 [2];
  lazy_ostream local_578 [3];
  undefined4 local_53c;
  assertion_result local_520 [2];
  const_string local_4e8 [2];
  lazy_ostream local_4c8 [2];
  size_t local_4a8;
  assertion_result local_480 [2];
  const_string local_448 [2];
  lazy_ostream local_428 [3];
  undefined4 local_3ec;
  assertion_result local_3d0 [2];
  const_string local_398 [2];
  lazy_ostream local_378 [4];
  assertion_result local_338 [2];
  void *b;
  const_string local_2f8 [2];
  lazy_ostream local_2d8 [3];
  undefined4 local_29c;
  assertion_result local_280 [2];
  const_string local_248 [2];
  lazy_ostream local_228 [3];
  undefined4 local_1ec;
  assertion_result local_1d0 [2];
  const_string local_198 [2];
  lazy_ostream local_178 [2];
  size_t local_158;
  assertion_result local_130 [2];
  void *block;
  const_string local_f0 [2];
  lazy_ostream local_d0 [2];
  size_t local_b0;
  assertion_result local_88 [2];
  size_t expected_bytes_available;
  PoolResource<8UL,_8UL> resource;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  PoolResource<8UL,_8UL>::PoolResource(in_stack_ffffffffffffee58);
  PoolResourceTester::CheckAllDataAccountedFor<8ul,8ul>
            ((PoolResource<8UL,_8UL> *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0)
            );
  expected_bytes_available = PoolResource<8UL,_8UL>::ChunkSizeBytes(in_stack_ffffffffffffee58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    local_b0 = PoolResourceTester::AvailableMemoryFromChunk<8ul,8ul>(in_stack_ffffffffffffee58);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_88,local_d0,local_f0,0x1b,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  block = PoolResource<8UL,_8UL>::Allocate
                    (in_stack_ffffffffffffee88,(size_t)in_stack_ffffffffffffee80,
                     in_stack_ffffffffffffee78);
  expected_bytes_available = expected_bytes_available - 8;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    local_158 = PoolResourceTester::AvailableMemoryFromChunk<8ul,8ul>(in_stack_ffffffffffffee58);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_130,local_178,local_198,0x20,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    local_1ec = 0;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,(int *)in_stack_ffffffffffffee58);
    PoolResourceTester::FreeListSizes<8ul,8ul>(in_stack_ffffffffffffeea8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68,
               (size_type)in_stack_ffffffffffffee60);
    boost::test_tools::assertion::expression_base<boost::test_tools::assertion::value_expr<int>,int>
    ::operator==((expression_base<boost::test_tools::assertion::value_expr<int>,_int> *)
                 in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1d0,local_228,local_248,0x22,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  PoolResource<8UL,_8UL>::Deallocate
            (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             CONCAT17(in_stack_ffffffffffffee77,in_stack_ffffffffffffee70));
  PoolResourceTester::CheckAllDataAccountedFor<8ul,8ul>
            ((PoolResource<8UL,_8UL> *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0)
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    local_29c = 1;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,(int *)in_stack_ffffffffffffee58);
    PoolResourceTester::FreeListSizes<8ul,8ul>(in_stack_ffffffffffffeea8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68,
               (size_type)in_stack_ffffffffffffee60);
    boost::test_tools::assertion::expression_base<boost::test_tools::assertion::value_expr<int>,int>
    ::operator==((expression_base<boost::test_tools::assertion::value_expr<int>,_int> *)
                 in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_280,local_2d8,local_2f8,0x25,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  b = PoolResource<8UL,_8UL>::Allocate
                (in_stack_ffffffffffffee88,(size_t)in_stack_ffffffffffffee80,
                 in_stack_ffffffffffffee78);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,(void **)in_stack_ffffffffffffee58);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<void*&>,void*>::operator==
              ((expression_base<boost::test_tools::assertion::value_expr<void_*&>,_void_*> *)
               in_stack_ffffffffffffee60,(void **)in_stack_ffffffffffffee58);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<void_*&>,_void_*&,_boost::test_tools::assertion::op::EQ<void_*,_void_*,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<void_*&>,_void_*&,_boost::test_tools::assertion::op::EQ<void_*,_void_*,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_338,local_378,local_398,0x29,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    local_3ec = 0;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,(int *)in_stack_ffffffffffffee58);
    PoolResourceTester::FreeListSizes<8ul,8ul>(in_stack_ffffffffffffeea8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68,
               (size_type)in_stack_ffffffffffffee60);
    boost::test_tools::assertion::expression_base<boost::test_tools::assertion::value_expr<int>,int>
    ::operator==((expression_base<boost::test_tools::assertion::value_expr<int>,_int> *)
                 in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3d0,local_428,local_448,0x2a,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    local_4a8 = PoolResourceTester::AvailableMemoryFromChunk<8ul,8ul>(in_stack_ffffffffffffee58);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_480,local_4c8,local_4e8,0x2b,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  PoolResource<8UL,_8UL>::Deallocate
            (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             CONCAT17(in_stack_ffffffffffffee77,in_stack_ffffffffffffee70));
  PoolResourceTester::CheckAllDataAccountedFor<8ul,8ul>
            ((PoolResource<8UL,_8UL> *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0)
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    local_53c = 1;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,(int *)in_stack_ffffffffffffee58);
    PoolResourceTester::FreeListSizes<8ul,8ul>(in_stack_ffffffffffffeea8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68,
               (size_type)in_stack_ffffffffffffee60);
    boost::test_tools::assertion::expression_base<boost::test_tools::assertion::value_expr<int>,int>
    ::operator==((expression_base<boost::test_tools::assertion::value_expr<int>,_int> *)
                 in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_520,local_578,local_598,0x2f,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    local_5f8 = PoolResourceTester::AvailableMemoryFromChunk<8ul,8ul>(in_stack_ffffffffffffee58);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5d0,local_618,local_638,0x30,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  b = PoolResource<8UL,_8UL>::Allocate
                (in_stack_ffffffffffffee88,(size_t)in_stack_ffffffffffffee80,
                 in_stack_ffffffffffffee78);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,(void **)in_stack_ffffffffffffee58);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<void*&>,void*>::operator!=
              ((expression_base<boost::test_tools::assertion::value_expr<void_*&>,_void_*> *)
               in_stack_ffffffffffffee60,(void **)in_stack_ffffffffffffee58);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<void_*&>,_void_*&,_boost::test_tools::assertion::op::NE<void_*,_void_*,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<void_*&>,_void_*&,_boost::test_tools::assertion::op::NE<void_*,_void_*,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_670,local_6b0,local_6d0,0x34,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  block = b;
  PoolResourceTester::CheckAllDataAccountedFor<8ul,8ul>
            ((PoolResource<8UL,_8UL> *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0)
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    local_724 = 1;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,(int *)in_stack_ffffffffffffee58);
    PoolResourceTester::FreeListSizes<8ul,8ul>(in_stack_ffffffffffffeea8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68,
               (size_type)in_stack_ffffffffffffee60);
    boost::test_tools::assertion::expression_base<boost::test_tools::assertion::value_expr<int>,int>
    ::operator==((expression_base<boost::test_tools::assertion::value_expr<int>,_int> *)
                 in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_708,local_760,local_780,0x37,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    local_7e0 = PoolResourceTester::AvailableMemoryFromChunk<8ul,8ul>(in_stack_ffffffffffffee58);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7b8,local_800,local_820,0x38,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  PoolResource<8UL,_8UL>::Deallocate
            (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             CONCAT17(in_stack_ffffffffffffee77,in_stack_ffffffffffffee70));
  PoolResourceTester::CheckAllDataAccountedFor<8ul,8ul>
            ((PoolResource<8UL,_8UL> *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0)
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    local_874 = 1;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,(int *)in_stack_ffffffffffffee58);
    PoolResourceTester::FreeListSizes<8ul,8ul>(in_stack_ffffffffffffeea8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68,
               (size_type)in_stack_ffffffffffffee60);
    boost::test_tools::assertion::expression_base<boost::test_tools::assertion::value_expr<int>,int>
    ::operator==((expression_base<boost::test_tools::assertion::value_expr<int>,_int> *)
                 in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_858,local_8b0,local_8d0,0x3c,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    local_930 = PoolResourceTester::AvailableMemoryFromChunk<8ul,8ul>(in_stack_ffffffffffffee58);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_908,local_950,local_970,0x3d,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  block = PoolResource<8UL,_8UL>::Allocate
                    (in_stack_ffffffffffffee88,(size_t)in_stack_ffffffffffffee80,
                     in_stack_ffffffffffffee78);
  PoolResourceTester::CheckAllDataAccountedFor<8ul,8ul>
            ((PoolResource<8UL,_8UL> *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0)
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    local_9c4 = 1;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,(int *)in_stack_ffffffffffffee58);
    PoolResourceTester::FreeListSizes<8ul,8ul>(in_stack_ffffffffffffeea8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68,
               (size_type)in_stack_ffffffffffffee60);
    boost::test_tools::assertion::expression_base<boost::test_tools::assertion::value_expr<int>,int>
    ::operator==((expression_base<boost::test_tools::assertion::value_expr<int>,_int> *)
                 in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9a8,local_a00,local_a20,0x42,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    local_a80 = PoolResourceTester::AvailableMemoryFromChunk<8ul,8ul>(in_stack_ffffffffffffee58);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a58,local_aa0,local_ac0,0x43,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  PoolResource<8UL,_8UL>::Deallocate
            (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             CONCAT17(in_stack_ffffffffffffee77,in_stack_ffffffffffffee70));
  PoolResourceTester::CheckAllDataAccountedFor<8ul,8ul>
            ((PoolResource<8UL,_8UL> *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0)
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    local_b14 = 1;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,(int *)in_stack_ffffffffffffee58);
    PoolResourceTester::FreeListSizes<8ul,8ul>(in_stack_ffffffffffffeea8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68,
               (size_type)in_stack_ffffffffffffee60);
    boost::test_tools::assertion::expression_base<boost::test_tools::assertion::value_expr<int>,int>
    ::operator==((expression_base<boost::test_tools::assertion::value_expr<int>,_int> *)
                 in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_af8,local_b50,local_b70,0x47,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    local_bd0 = PoolResourceTester::AvailableMemoryFromChunk<8ul,8ul>(in_stack_ffffffffffffee58);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ba8,local_bf0,local_c10,0x48,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    uVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar3);
  PoolResource<8UL,_8UL>::Allocate
            (in_stack_ffffffffffffee88,(size_t)in_stack_ffffffffffffee80,in_stack_ffffffffffffee78);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    local_c64 = 0;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,(int *)in_stack_ffffffffffffee58);
    PoolResourceTester::FreeListSizes<8ul,8ul>(in_stack_ffffffffffffeea8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68,
               (size_type)in_stack_ffffffffffffee60);
    boost::test_tools::assertion::expression_base<boost::test_tools::assertion::value_expr<int>,int>
    ::operator==((expression_base<boost::test_tools::assertion::value_expr<int>,_int> *)
                 in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c48,local_ca0,local_cc0,0x4d,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    local_d20 = PoolResourceTester::AvailableMemoryFromChunk<8ul,8ul>(in_stack_ffffffffffffee58);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_cf8,local_d40,local_d60,0x4e,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  resource_00 = &resource;
  PoolResource<8UL,_8UL>::Deallocate
            (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             CONCAT17(in_stack_ffffffffffffee77,in_stack_ffffffffffffee70));
  PoolResourceTester::CheckAllDataAccountedFor<8ul,8ul>
            ((PoolResource<8UL,_8UL> *)CONCAT17(uVar3,in_stack_ffffffffffffeef0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               (size_t)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
    local_db4 = 1;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,(int *)in_stack_ffffffffffffee58);
    PoolResourceTester::FreeListSizes<8ul,8ul>(resource_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68,
               (size_type)in_stack_ffffffffffffee60);
    boost::test_tools::assertion::expression_base<boost::test_tools::assertion::value_expr<int>,int>
    ::operator==((expression_base<boost::test_tools::assertion::value_expr<int>,_int> *)
                 in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long_&,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               SUB81((ulong)in_stack_ffffffffffffee88 >> 0x38,0));
    in_stack_ffffffffffffee98 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d98,local_df0,local_e10,0x52,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffee68);
    in_stack_ffffffffffffee97 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffee97);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffee98,
               (const_string *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
               line_num,in_stack_ffffffffffffee80);
    uVar3 = (undefined1)(line_num >> 0x38);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    in_stack_ffffffffffffee80 =
         (const_string *)
         PoolResourceTester::AvailableMemoryFromChunk<8ul,8ul>(in_stack_ffffffffffffee58);
    local_e70 = in_stack_ffffffffffffee80;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                *)in_stack_ffffffffffffee60,&in_stack_ffffffffffffee58->m_chunk_size_bytes);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),(bool)uVar3);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffee60,(basic_cstring<const_char> *)in_stack_ffffffffffffee58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee68,
               (pointer)in_stack_ffffffffffffee60,(unsigned_long)in_stack_ffffffffffffee58);
    in_stack_ffffffffffffee58 = (PoolResource<8UL,_8UL> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e48,local_e90,local_eb0,0x53,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffee58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  PoolResource<8UL,_8UL>::~PoolResource(in_stack_ffffffffffffee68);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(basic_allocating)
{
    auto resource = PoolResource<8, 8>();
    PoolResourceTester::CheckAllDataAccountedFor(resource);

    // first chunk is already allocated
    size_t expected_bytes_available = resource.ChunkSizeBytes();
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    // chunk is used, no more allocation
    void* block = resource.Allocate(8, 8);
    expected_bytes_available -= 8;
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    BOOST_TEST(0 == PoolResourceTester::FreeListSizes(resource)[1]);
    resource.Deallocate(block, 8, 8);
    PoolResourceTester::CheckAllDataAccountedFor(resource);
    BOOST_TEST(1 == PoolResourceTester::FreeListSizes(resource)[1]);

    // alignment is too small, but the best fitting freelist is used. Nothing is allocated.
    void* b = resource.Allocate(8, 1);
    BOOST_TEST(b == block); // we got the same block of memory as before
    BOOST_TEST(0 == PoolResourceTester::FreeListSizes(resource)[1]);
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    resource.Deallocate(block, 8, 1);
    PoolResourceTester::CheckAllDataAccountedFor(resource);
    BOOST_TEST(1 == PoolResourceTester::FreeListSizes(resource)[1]);
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    // can't use resource because alignment is too big, allocate system memory
    b = resource.Allocate(8, 16);
    BOOST_TEST(b != block);
    block = b;
    PoolResourceTester::CheckAllDataAccountedFor(resource);
    BOOST_TEST(1 == PoolResourceTester::FreeListSizes(resource)[1]);
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    resource.Deallocate(block, 8, 16);
    PoolResourceTester::CheckAllDataAccountedFor(resource);
    BOOST_TEST(1 == PoolResourceTester::FreeListSizes(resource)[1]);
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    // can't use chunk because size is too big
    block = resource.Allocate(16, 8);
    PoolResourceTester::CheckAllDataAccountedFor(resource);
    BOOST_TEST(1 == PoolResourceTester::FreeListSizes(resource)[1]);
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    resource.Deallocate(block, 16, 8);
    PoolResourceTester::CheckAllDataAccountedFor(resource);
    BOOST_TEST(1 == PoolResourceTester::FreeListSizes(resource)[1]);
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    // it's possible that 0 bytes are allocated, make sure this works. In that case the call is forwarded to operator new
    // 0 bytes takes one entry from the first freelist
    void* p = resource.Allocate(0, 1);
    BOOST_TEST(0 == PoolResourceTester::FreeListSizes(resource)[1]);
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));

    resource.Deallocate(p, 0, 1);
    PoolResourceTester::CheckAllDataAccountedFor(resource);
    BOOST_TEST(1 == PoolResourceTester::FreeListSizes(resource)[1]);
    BOOST_TEST(expected_bytes_available == PoolResourceTester::AvailableMemoryFromChunk(resource));
}